

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_bddInterval(DdManager *dd,int N,DdNode **x,uint lowerB,uint upperB)

{
  int *piVar1;
  ulong uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  bool bVar7;
  uint local_64;
  DdNode *local_60;
  
  pDVar5 = dd->one;
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 2;
  pDVar3 = pDVar5;
  local_60 = pDVar5;
  if (0 < N) {
    uVar2 = (ulong)(uint)N + 1;
    pDVar4 = pDVar5;
    local_64 = upperB;
    do {
      bVar7 = (lowerB & 1) == 0;
      pDVar3 = pDVar4;
      if (bVar7) {
        pDVar3 = pDVar5;
      }
      pDVar6 = (DdNode *)((ulong)pDVar5 ^ 1);
      if (bVar7) {
        pDVar6 = pDVar4;
      }
      pDVar3 = Cudd_bddIte(dd,x[uVar2 - 2],pDVar3,pDVar6);
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_IterDerefBdd(dd,pDVar4);
        goto LAB_007e26d2;
      }
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_IterDerefBdd(dd,pDVar4);
      bVar7 = (local_64 & 1) == 0;
      pDVar4 = local_60;
      if (bVar7) {
        pDVar4 = (DdNode *)((ulong)pDVar5 ^ 1);
      }
      pDVar6 = pDVar5;
      if (bVar7) {
        pDVar6 = local_60;
      }
      pDVar4 = Cudd_bddIte(dd,x[uVar2 - 2],pDVar4,pDVar6);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_IterDerefBdd(dd,pDVar3);
        goto LAB_007e26d2;
      }
      lowerB = lowerB >> 1;
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_IterDerefBdd(dd,local_60);
      local_64 = local_64 >> 1;
      uVar2 = uVar2 - 1;
      local_60 = pDVar4;
      pDVar4 = pDVar3;
    } while (1 < uVar2);
  }
  pDVar5 = Cudd_bddAnd(dd,pDVar3,local_60);
  if (pDVar5 == (DdNode *)0x0) {
    Cudd_IterDerefBdd(dd,pDVar3);
LAB_007e26d2:
    Cudd_IterDerefBdd(dd,local_60);
    pDVar5 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_IterDerefBdd(dd,pDVar3);
    Cudd_IterDerefBdd(dd,local_60);
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
  }
  return pDVar5;
}

Assistant:

DdNode *
Cudd_bddInterval(
  DdManager * dd /* DD manager */,
  int  N /* number of x variables */,
  DdNode ** x /* array of x variables */,
  unsigned int lowerB /* lower bound */,
  unsigned int upperB /* upper bound */)
{
    DdNode *one, *zero;
    DdNode *r, *rl, *ru;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    rl = one;
    cuddRef(rl);
    ru = one;
    cuddRef(ru);

    /* Loop to build the rest of the BDDs. */
    for (i = N-1; i >= 0; i--) {
        DdNode *vl, *vu;
        vl = Cudd_bddIte(dd, x[i],
                         lowerB&1 ? rl : one,
                         lowerB&1 ? zero : rl);
        if (vl == NULL) {
            Cudd_IterDerefBdd(dd, rl);
            Cudd_IterDerefBdd(dd, ru);
            return(NULL);
        }
        cuddRef(vl);
        Cudd_IterDerefBdd(dd, rl);
        rl = vl;
        lowerB >>= 1;
        vu = Cudd_bddIte(dd, x[i],
                         upperB&1 ? ru : zero,
                         upperB&1 ? one : ru);
        if (vu == NULL) {
            Cudd_IterDerefBdd(dd, rl);
            Cudd_IterDerefBdd(dd, ru);
            return(NULL);
        }
        cuddRef(vu);
        Cudd_IterDerefBdd(dd, ru);
        ru = vu;
        upperB >>= 1;
    }

    /* Conjoin the two bounds. */
    r = Cudd_bddAnd(dd, rl, ru);
    if (r == NULL) {
        Cudd_IterDerefBdd(dd, rl);
        Cudd_IterDerefBdd(dd, ru);
        return(NULL);
    }
    cuddRef(r);
    Cudd_IterDerefBdd(dd, rl);
    Cudd_IterDerefBdd(dd, ru);
    cuddDeref(r);
    return(r);

}